

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-ignore.c
# Opt level: O2

ignore_type_t ignore_type_of(object *obj)

{
  byte bVar1;
  char *pcVar2;
  long lVar3;
  
  bVar1 = obj->tval;
  lVar3 = 8;
  while( true ) {
    if (lVar3 == 0x248) {
      return ITYPE_MAX;
    }
    if ((*(uint *)((long)&slot_table[0xc].describe + lVar3 + 4) == (uint)bVar1) &&
       ((pcVar2 = *(char **)((long)&quality_mapping[0].ignore_type + lVar3), *pcVar2 == '\0' ||
        (pcVar2 = strstr(obj->kind->name,pcVar2), pcVar2 != (char *)0x0)))) break;
    lVar3 = lVar3 + 0x10;
  }
  return *(ignore_type_t *)((long)&slot_table[0xc].describe + lVar3);
}

Assistant:

ignore_type_t ignore_type_of(const struct object *obj)
{
	size_t i;

	/* Find the appropriate ignore group */
	for (i = 0; i < N_ELEMENTS(quality_mapping); i++) {
		if (quality_mapping[i].tval == obj->tval) {
			/* If there's an identifier, it must match */
			if (quality_mapping[i].identifier[0]) {
				if (!strstr(obj->kind->name, quality_mapping[i].identifier))
					continue;
			}
			/* Otherwise we're fine */
			return quality_mapping[i].ignore_type;
		}
	}

	return ITYPE_MAX;
}